

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

double __thiscall asl::Log::log(Log *this,double __x)

{
  bool bVar1;
  int iVar2;
  int b;
  Long LVar3;
  String *s;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  double in_RCX;
  int in_EDX;
  String *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar7;
  int local_254;
  int local_250;
  TextFile local_240;
  String local_1f8;
  undefined1 local_1e0 [8];
  String line;
  char *pcStack_1c0;
  Color color;
  char *slevel;
  String local_170;
  Path local_158;
  Path local_140;
  Path local_128;
  undefined1 local_110 [8];
  String oldfile;
  Path path;
  File local_d8;
  undefined1 local_90 [8];
  String logfile;
  Lock local_68;
  Lock lock;
  undefined1 local_58 [7];
  bool useconsole;
  String catg;
  int i1;
  int dot;
  int i0;
  int slash;
  Date now;
  String *message_local;
  Level level_local;
  String *cat_local;
  Log *this_local;
  
  now._t = in_RCX;
  updateState(this);
  dVar7 = extraout_XMM0_Qa;
  if (in_EDX <= this->_maxLevel) {
    Date::now();
    iVar2 = asl::String::lastIndexOf(in_RSI,'\\');
    b = asl::String::lastIndexOf(in_RSI,'/');
    local_250 = max<int>(iVar2,b);
    if (local_250 < 0) {
      local_250 = 0;
    }
    else {
      local_250 = local_250 + 1;
    }
    local_254 = asl::String::lastIndexOf(in_RSI,'.');
    catg.field_2._12_4_ = local_254;
    if (local_254 < 0) {
      local_254 = asl::String::length(in_RSI);
    }
    catg.field_2._8_4_ = local_254;
    asl::String::substring((String *)local_58,in_RSI,local_250,local_254);
    lock._m._7_1_ = this->_useconsole & 1;
    Lock::Lock(&local_68,this->_mutex);
    asl::String::String((String *)local_90,&this->_logfile);
    bVar1 = false;
    if ((this->_usefile & 1U) != 0) {
      TextFile::TextFile((TextFile *)&local_d8,(String *)local_90);
      LVar3 = File::size(&local_d8);
      bVar1 = 1000000 < LVar3;
      TextFile::~TextFile((TextFile *)&local_d8);
    }
    if (bVar1) {
      Path::Path((Path *)((long)&oldfile.field_2 + 8),(String *)local_90);
      Path::noExt(&local_158,(Path *)((long)&oldfile.field_2 + 8));
      Path::operator+(&local_140,&local_158,"-1.");
      Path::extension(&local_170,(Path *)((long)&oldfile.field_2 + 8));
      Path::operator+(&local_128,&local_140,&local_170);
      s = Path::operator_cast_to_String_(&local_128);
      asl::String::String((String *)local_110,s);
      Path::~Path(&local_128);
      asl::String::~String(&local_170);
      Path::~Path(&local_140);
      Path::~Path(&local_158);
      File::File((File *)&slevel,(String *)local_110);
      bVar1 = File::exists((File *)&slevel);
      File::~File((File *)&slevel);
      if (bVar1) {
        Directory::remove(local_110);
      }
      Directory::move((String *)local_90,(String *)local_110);
      asl::String::~String((String *)local_110);
      Path::~Path((Path *)((long)&oldfile.field_2 + 8));
    }
    pcStack_1c0 = "";
    line.field_2._12_4_ = 0;
    switch(in_EDX) {
    case 0:
      pcStack_1c0 = "ERROR: ";
      line.field_2._12_4_ = 0x11;
      break;
    case 1:
      pcStack_1c0 = "WARNING: ";
      line.field_2._12_4_ = 0x17;
      break;
    default:
      break;
    case 3:
      line.field_2._12_4_ = 2;
      break;
    case 4:
      line.field_2._12_4_ = 6;
    }
    if (((lock._m._7_1_ & 1) != 0) && (line.field_2._12_4_ != 0)) {
      Console::color((Console *)&console,line.field_2._12_4_);
    }
    Date::toString(&local_1f8,(Date *)&i0,LONG);
    pcVar4 = asl::String::operator*(&local_1f8);
    pcVar5 = asl::String::operator*((String *)local_58);
    pcVar6 = asl::String::operator*((String *)now._t);
    asl::String::String((String *)local_1e0,0,"[%s][%s] %s%s\n",pcVar4,pcVar5,pcStack_1c0,pcVar6);
    asl::String::~String(&local_1f8);
    bVar1 = asl::String::endsWith((String *)now._t,'\n');
    if (bVar1) {
      iVar2 = asl::String::length((String *)local_1e0);
      asl::String::resize((String *)local_1e0,iVar2 + -1,true,true);
    }
    if ((this->_usefile & 1U) != 0) {
      TextFile::TextFile(&local_240,&this->_logfile);
      TextFile::append(&local_240,(String *)local_1e0);
      TextFile::~TextFile(&local_240);
    }
    if ((lock._m._7_1_ & 1) != 0) {
      asl::String::operator*((String *)local_1e0);
      printf("%s");
      if (line.field_2._12_4_ != 0) {
        Console::color((Console *)&console,COLOR_DEFAULT);
      }
    }
    asl::String::~String((String *)local_1e0);
    asl::String::~String((String *)local_90);
    Lock::~Lock(&local_68);
    asl::String::~String((String *)local_58);
    dVar7 = extraout_XMM0_Qa_00;
  }
  return dVar7;
}

Assistant:

void Log::log(const String& cat, Log::Level level, const String& message)
{
	updateState();
	if (level > _maxLevel)
		return;

	Date now = Date::now();

	// remove directory and extension, so __FILE__ can be used as category
	int slash = max(cat.lastIndexOf('\\'), cat.lastIndexOf('/'));
	int i0 = (slash<0) ? 0 : slash + 1;
	int dot = cat.lastIndexOf('.');
	int i1 = (dot<0) ? cat.length() : dot;
	String catg = cat.substring(i0, i1);
	bool useconsole = _useconsole;

	Lock lock(*_mutex);

#ifndef __ANDROID_API__
	String logfile = _logfile;
	if (_usefile && TextFile(logfile).size() > ASL_LOG_MAX_SIZE)
	{
		Path   path = logfile;
		String oldfile = path.noExt() + "-1." + path.extension();
		if (File(oldfile).exists())
			Directory::remove(oldfile);
		Directory::move(logfile, oldfile);
	}
#endif

	const char* slevel = "";
	Console::Color color = Console::COLOR_DEFAULT;

	switch (level)
	{
	case Log::WARNING:
		slevel = "WARNING: ";
		color = Console::BYELLOW;
		break;
	case Log::ERR:
		slevel = "ERROR: ";
		color = Console::BRED;
		break;
	case Log::DEBUG:
		color = Console::GREEN;
		break;
	case Log::VERBOSE:
		color = Console::CYAN;
		break;
	default:
		break;
	}

	if (useconsole && color != Console::COLOR_DEFAULT)
		console.color(color);

	String line(0, "[%s][%s] %s%s\n", *now.toString(), *catg, slevel, *message);

	if (message.endsWith('\n'))
		line.resize(line.length() - 1);

	if (_usefile)
		TextFile(_logfile).append(line);

	if (useconsole)
	{
		printf("%s", *line);
		if (color != Console::COLOR_DEFAULT)
			console.color();
	}
}